

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap.h
# Opt level: O3

void __thiscall
Glucose::Heap<Glucose::Solver::VarOrderLt>::percolateDown
          (Heap<Glucose::Solver::VarOrderLt> *this,int i)

{
  double dVar1;
  int iVar2;
  int *piVar3;
  double *pdVar4;
  int *piVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  double dVar12;
  double dVar13;
  
  piVar3 = (this->heap).data;
  lVar7 = (long)i;
  iVar2 = piVar3[lVar7];
  iVar8 = i * 2 + 1;
  iVar10 = (this->heap).sz;
  if (iVar8 < iVar10) {
    iVar6 = i * 2;
    piVar5 = (this->indices).data;
    pdVar4 = ((this->lt).activity)->data;
    dVar1 = pdVar4[iVar2];
    do {
      iVar9 = iVar6 + 2;
      if (iVar9 < iVar10) {
        iVar6 = piVar3[iVar9];
        lVar7 = (long)piVar3[iVar8];
        dVar12 = pdVar4[lVar7];
        lVar11 = (long)iVar6;
        dVar13 = pdVar4[iVar6];
        iVar10 = piVar3[iVar8];
        if (pdVar4[iVar6] <= dVar12) goto LAB_00111252;
      }
      else {
        lVar7 = (long)piVar3[iVar8];
        dVar12 = pdVar4[lVar7];
        iVar10 = piVar3[iVar8];
LAB_00111252:
        iVar6 = iVar10;
        lVar11 = lVar7;
        dVar13 = dVar12;
        iVar9 = iVar8;
      }
      if (dVar13 <= dVar1) break;
      piVar3[i] = iVar6;
      piVar5[lVar11] = i;
      iVar6 = iVar9 * 2;
      iVar8 = iVar9 * 2 + 1;
      iVar10 = (this->heap).sz;
      i = iVar9;
    } while (iVar8 < iVar10);
    lVar7 = (long)i;
  }
  else {
    piVar5 = (this->indices).data;
  }
  piVar3[lVar7] = iVar2;
  piVar5[iVar2] = i;
  return;
}

Assistant:

void percolateDown(int i)
    {
        int x = heap[i];
        while (left(i) < heap.size()){
            int child = right(i) < heap.size() && lt(heap[right(i)], heap[left(i)]) ? right(i) : left(i);
            if (!lt(heap[child], x)) break;
            heap[i]          = heap[child];
            indices[heap[i]] = i;
            i                = child;
        }
        heap   [i] = x;
        indices[x] = i;
    }